

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void build_movep_er(m68k_info *info,int size)

{
  uint uVar1;
  ushort uVar2;
  ulong uVar3;
  
  MCInst_setOpcode(info->inst,0x11d);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1.cpu_size = size;
  (info->extension).operands[0].type = M68K_OP_MEM;
  (info->extension).operands[0].address_mode = M68K_AM_REGI_ADDR_DISP;
  uVar1 = info->ir;
  (info->extension).operands[0].mem.base_reg = (uVar1 & 7) + M68K_REG_A0;
  uVar3 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  uVar2 = 0xaaaa;
  if (uVar3 + 2 <= info->code_len) {
    uVar2 = *(ushort *)(info->code + uVar3) << 8 | *(ushort *)(info->code + uVar3) >> 8;
  }
  info->pc = info->pc + 2;
  (info->extension).operands[0].mem.disp = uVar2;
  (info->extension).operands[1].field_0.reg = (uVar1 >> 9 & 7) + M68K_REG_D0;
  return;
}

Assistant:

static void build_movep_er(m68k_info *info, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVEP, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->address_mode = M68K_AM_REGI_ADDR_DISP;
	op0->type = M68K_OP_MEM;
	op0->mem.base_reg = M68K_REG_A0 + (info->ir & 7);
	op0->mem.disp = (int16_t)read_imm_16(info);

	op1->reg = M68K_REG_D0 + ((info->ir >> 9) & 7);
}